

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const*&,char_const(&)[2],kj::StringTree,kj::String&,char_const*&>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          StringTree *params_2,String *params_3,char **params_4)

{
  char *pcVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> *in_stack_ffffffffffffff88;
  ArrayPtr<const_char> local_70;
  char *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  Branch *local_40;
  char *local_38;
  
  pcVar1 = *(char **)this;
  local_58 = (char *)strlen(pcVar1);
  local_60 = pcVar1;
  local_70.size_ = strlen((char *)params);
  pBVar2 = (Branch *)(params_2->text).content.ptr;
  local_40 = pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40 = (Branch *)params_2->size_;
  }
  local_38 = (char *)0x0;
  if (pBVar2 != (Branch *)0x0) {
    local_38 = (char *)((long)&pBVar2[-1].content.branches.disposer + 7);
  }
  pcVar1 = (params_3->content).ptr;
  local_70.ptr = (char *)params;
  local_50.size_ = strlen(pcVar1);
  local_50.ptr = pcVar1;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_60,&local_70,
             (ArrayPtr<const_char> *)params_1,(StringTree *)&local_40,&local_50,
             in_stack_ffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}